

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

int mbedtls_internal_sha256_process(mbedtls_sha256_context *ctx,uchar *data)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  long lVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  bool bVar11;
  long lVar12;
  uint *puVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  uint local_174 [3];
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_140;
  uint local_138 [66];
  
  local_140 = ctx->state;
  local_168 = *(undefined8 *)ctx->state;
  uStack_160 = *(undefined8 *)(ctx->state + 2);
  local_158 = *(undefined8 *)(ctx->state + 4);
  uVar10 = *(undefined8 *)(ctx->state + 6);
  uStack_150 = uVar10;
  lVar12 = 0;
  do {
    uVar15 = *(uint *)(data + lVar12 * 4);
    local_138[lVar12] =
         uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x10);
  uStack_150._4_4_ = (uint)((ulong)uVar10 >> 0x20);
  uStack_150._0_4_ = (uint)uVar10;
  local_158._4_4_ = (uint)((ulong)local_158 >> 0x20);
  local_168._4_4_ = (uint)((ulong)local_168 >> 0x20);
  puVar13 = local_138;
  uStack_160._4_4_ = (uint)((ulong)uStack_160 >> 0x20);
  lVar12 = 0;
  bVar20 = true;
  do {
    bVar11 = bVar20;
    iVar16 = (((uint)local_158 << 7 | (uint)local_158 >> 0x19) ^
             ((uint)local_158 << 0x15 | (uint)local_158 >> 0xb) ^
             ((uint)local_158 << 0x1a | (uint)local_158 >> 6)) + uStack_150._4_4_ + K[lVar12] +
             *puVar13 + ((local_158._4_4_ ^ (uint)uStack_150) & (uint)local_158 ^ (uint)uStack_150);
    uStack_160._4_4_ = uStack_160._4_4_ + iVar16;
    uStack_150._4_4_ =
         ((local_168._4_4_ | (uint)local_168) & (uint)uStack_160 | local_168._4_4_ & (uint)local_168
         ) + (((uint)local_168 << 10 | (uint)local_168 >> 0x16) ^
             ((uint)local_168 << 0x13 | (uint)local_168 >> 0xd) ^
             ((uint)local_168 << 0x1e | (uint)local_168 >> 2)) + iVar16;
    iVar16 = ((local_158._4_4_ ^ (uint)local_158) & uStack_160._4_4_ ^ local_158._4_4_) +
             (uint)uStack_150 + K[lVar12 + 1] +
             ((uStack_160._4_4_ * 0x80 | uStack_160._4_4_ >> 0x19) ^
             (uStack_160._4_4_ * 0x200000 | uStack_160._4_4_ >> 0xb) ^
             (uStack_160._4_4_ * 0x4000000 | uStack_160._4_4_ >> 6)) + local_138[lVar12 + 1];
    uStack_160._0_4_ = (uint)uStack_160 + iVar16;
    uStack_150._0_4_ =
         ((uStack_150._4_4_ | (uint)local_168) & local_168._4_4_ |
         uStack_150._4_4_ & (uint)local_168) +
         ((uStack_150._4_4_ * 0x400 | uStack_150._4_4_ >> 0x16) ^
         (uStack_150._4_4_ * 0x80000 | uStack_150._4_4_ >> 0xd) ^
         (uStack_150._4_4_ * 0x40000000 | uStack_150._4_4_ >> 2)) + iVar16;
    iVar16 = local_158._4_4_ + K[lVar12 + 2] + local_138[lVar12 + 2] +
             ((uStack_160._4_4_ ^ (uint)local_158) & (uint)uStack_160 ^ (uint)local_158) +
             (((uint)uStack_160 * 0x80 | (uint)uStack_160 >> 0x19) ^
             ((uint)uStack_160 * 0x200000 | (uint)uStack_160 >> 0xb) ^
             ((uint)uStack_160 * 0x4000000 | (uint)uStack_160 >> 6));
    local_168._4_4_ = local_168._4_4_ + iVar16;
    local_158._4_4_ =
         iVar16 + (((uint)uStack_150 | uStack_150._4_4_) & (uint)local_168 |
                  (uint)uStack_150 & uStack_150._4_4_) +
                  (((uint)uStack_150 * 0x400 | (uint)uStack_150 >> 0x16) ^
                  ((uint)uStack_150 * 0x80000 | (uint)uStack_150 >> 0xd) ^
                  ((uint)uStack_150 * 0x40000000 | (uint)uStack_150 >> 2));
    iVar16 = (uint)local_158 + K[lVar12 + 3] + local_138[lVar12 + 3] +
             (((uint)uStack_160 ^ uStack_160._4_4_) & local_168._4_4_ ^ uStack_160._4_4_) +
             ((local_168._4_4_ * 0x80 | local_168._4_4_ >> 0x19) ^
             (local_168._4_4_ * 0x200000 | local_168._4_4_ >> 0xb) ^
             (local_168._4_4_ * 0x4000000 | local_168._4_4_ >> 6));
    local_168._0_4_ = (uint)local_168 + iVar16;
    local_158._0_4_ =
         iVar16 + ((local_158._4_4_ | (uint)uStack_150) & uStack_150._4_4_ |
                  local_158._4_4_ & (uint)uStack_150) +
                  ((local_158._4_4_ * 0x400 | local_158._4_4_ >> 0x16) ^
                  (local_158._4_4_ * 0x80000 | local_158._4_4_ >> 0xd) ^
                  (local_158._4_4_ * 0x40000000 | local_158._4_4_ >> 2));
    iVar16 = uStack_160._4_4_ + K[lVar12 + 4] + local_138[lVar12 + 4] +
             ((local_168._4_4_ ^ (uint)uStack_160) & (uint)local_168 ^ (uint)uStack_160) +
             (((uint)local_168 * 0x80 | (uint)local_168 >> 0x19) ^
             ((uint)local_168 * 0x200000 | (uint)local_168 >> 0xb) ^
             ((uint)local_168 * 0x4000000 | (uint)local_168 >> 6));
    uStack_150._4_4_ = uStack_150._4_4_ + iVar16;
    uStack_160._4_4_ =
         (((uint)local_158 | local_158._4_4_) & (uint)uStack_150 | (uint)local_158 & local_158._4_4_
         ) + (((uint)local_158 * 0x400 | (uint)local_158 >> 0x16) ^
             ((uint)local_158 * 0x80000 | (uint)local_158 >> 0xd) ^
             ((uint)local_158 * 0x40000000 | (uint)local_158 >> 2)) + iVar16;
    iVar16 = (uint)uStack_160 + K[lVar12 + 5] + local_138[lVar12 + 5] +
             (((uint)local_168 ^ local_168._4_4_) & uStack_150._4_4_ ^ local_168._4_4_) +
             ((uStack_150._4_4_ * 0x80 | uStack_150._4_4_ >> 0x19) ^
             (uStack_150._4_4_ * 0x200000 | uStack_150._4_4_ >> 0xb) ^
             (uStack_150._4_4_ * 0x4000000 | uStack_150._4_4_ >> 6));
    uStack_150._0_4_ = (uint)uStack_150 + iVar16;
    uStack_160._0_4_ =
         ((uStack_160._4_4_ | (uint)local_158) & local_158._4_4_ |
         uStack_160._4_4_ & (uint)local_158) +
         ((uStack_160._4_4_ * 0x400 | uStack_160._4_4_ >> 0x16) ^
         (uStack_160._4_4_ * 0x80000 | uStack_160._4_4_ >> 0xd) ^
         (uStack_160._4_4_ * 0x40000000 | uStack_160._4_4_ >> 2)) + iVar16;
    iVar16 = local_168._4_4_ + K[lVar12 + 6] + local_138[lVar12 + 6] +
             ((uStack_150._4_4_ ^ (uint)local_168) & (uint)uStack_150 ^ (uint)local_168) +
             (((uint)uStack_150 * 0x80 | (uint)uStack_150 >> 0x19) ^
             ((uint)uStack_150 * 0x200000 | (uint)uStack_150 >> 0xb) ^
             ((uint)uStack_150 * 0x4000000 | (uint)uStack_150 >> 6));
    local_158._4_4_ = local_158._4_4_ + iVar16;
    local_168._4_4_ =
         (((uint)uStack_160 | uStack_160._4_4_) & (uint)local_158 |
         (uint)uStack_160 & uStack_160._4_4_) +
         (((uint)uStack_160 * 0x400 | (uint)uStack_160 >> 0x16) ^
         ((uint)uStack_160 * 0x80000 | (uint)uStack_160 >> 0xd) ^
         ((uint)uStack_160 * 0x40000000 | (uint)uStack_160 >> 2)) + iVar16;
    iVar16 = (uint)local_168 + K[lVar12 + 7] + local_138[lVar12 + 7] +
             (((uint)uStack_150 ^ uStack_150._4_4_) & local_158._4_4_ ^ uStack_150._4_4_) +
             ((local_158._4_4_ * 0x80 | local_158._4_4_ >> 0x19) ^
             (local_158._4_4_ * 0x200000 | local_158._4_4_ >> 0xb) ^
             (local_158._4_4_ * 0x4000000 | local_158._4_4_ >> 6));
    local_158._0_4_ = (uint)local_158 + iVar16;
    local_168._0_4_ =
         ((local_168._4_4_ | (uint)uStack_160) & uStack_160._4_4_ |
         local_168._4_4_ & (uint)uStack_160) +
         ((local_168._4_4_ * 0x400 | local_168._4_4_ >> 0x16) ^
         (local_168._4_4_ * 0x80000 | local_168._4_4_ >> 0xd) ^
         (local_168._4_4_ * 0x40000000 | local_168._4_4_ >> 2)) + iVar16;
    puVar13 = local_138 + 8;
    lVar12 = 8;
    bVar20 = false;
  } while (bVar11);
  local_148 = 0x10;
  do {
    uVar15 = *(uint *)((long)&local_140 + local_148 * 4);
    uVar4 = local_174[local_148];
    uVar14 = local_174[local_148 + 1];
    uVar17 = (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7)) +
             local_138[0] +
             (uVar15 >> 10 ^ (uVar15 << 0xd | uVar15 >> 0x13) ^ (uVar15 << 0xf | uVar15 >> 0x11)) +
             *(int *)((long)&local_158 + local_148 * 4 + 4);
    local_138[local_148] = uVar17;
    iVar16 = (((uint)local_158 << 7 | (uint)local_158 >> 0x19) ^
             ((uint)local_158 << 0x15 | (uint)local_158 >> 0xb) ^
             ((uint)local_158 << 0x1a | (uint)local_158 >> 6)) + uStack_150._4_4_ + K[local_148] +
             ((local_158._4_4_ ^ (uint)uStack_150) & (uint)local_158 ^ (uint)uStack_150) + uVar17;
    uStack_160._4_4_ = uStack_160._4_4_ + iVar16;
    uStack_150._4_4_ =
         ((local_168._4_4_ | (uint)local_168) & (uint)uStack_160 | local_168._4_4_ & (uint)local_168
         ) + (((uint)local_168 << 10 | (uint)local_168 >> 0x16) ^
             ((uint)local_168 << 0x13 | (uint)local_168 >> 0xd) ^
             ((uint)local_168 << 0x1e | (uint)local_168 >> 2)) + iVar16;
    uVar15 = *(uint *)((long)&local_140 + local_148 * 4 + 4);
    uVar18 = uVar4 + *(int *)((long)&uStack_150 + local_148 * 4) +
             (uVar15 >> 10 ^ (uVar15 << 0xd | uVar15 >> 0x13) ^ (uVar15 << 0xf | uVar15 >> 0x11)) +
             (uVar14 >> 3 ^ (uVar14 << 0xe | uVar14 >> 0x12) ^ (uVar14 << 0x19 | uVar14 >> 7));
    local_138[local_148 + 1] = uVar18;
    iVar16 = ((uStack_160._4_4_ * 0x80 | uStack_160._4_4_ >> 0x19) ^
             (uStack_160._4_4_ * 0x200000 | uStack_160._4_4_ >> 0xb) ^
             (uStack_160._4_4_ * 0x4000000 | uStack_160._4_4_ >> 6)) + uVar18 +
             ((local_158._4_4_ ^ (uint)local_158) & uStack_160._4_4_ ^ local_158._4_4_) +
             (uint)uStack_150 + K[local_148 + 1];
    uStack_160._0_4_ = (uint)uStack_160 + iVar16;
    uStack_150._0_4_ =
         ((uStack_150._4_4_ | (uint)local_168) & local_168._4_4_ |
         uStack_150._4_4_ & (uint)local_168) +
         ((uStack_150._4_4_ * 0x400 | uStack_150._4_4_ >> 0x16) ^
         (uStack_150._4_4_ * 0x80000 | uStack_150._4_4_ >> 0xd) ^
         (uStack_150._4_4_ * 0x40000000 | uStack_150._4_4_ >> 2)) + iVar16;
    uVar15 = local_174[local_148 + 2];
    uVar14 = (uVar17 >> 10 ^ (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11)
             ) + uVar14 + *(int *)((long)&uStack_150 + local_148 * 4 + 4) +
             (uVar15 >> 3 ^ (uVar15 << 0xe | uVar15 >> 0x12) ^ (uVar15 << 0x19 | uVar15 >> 7));
    local_138[local_148 + 2] = uVar14;
    iVar16 = local_158._4_4_ + K[local_148 + 2] +
             ((uStack_160._4_4_ ^ (uint)local_158) & (uint)uStack_160 ^ (uint)local_158) + uVar14 +
             (((uint)uStack_160 * 0x80 | (uint)uStack_160 >> 0x19) ^
             ((uint)uStack_160 * 0x200000 | (uint)uStack_160 >> 0xb) ^
             ((uint)uStack_160 * 0x4000000 | (uint)uStack_160 >> 6));
    local_168._4_4_ = local_168._4_4_ + iVar16;
    local_158._4_4_ =
         iVar16 + (((uint)uStack_150 | uStack_150._4_4_) & (uint)local_168 |
                  (uint)uStack_150 & uStack_150._4_4_) +
                  (((uint)uStack_150 * 0x400 | (uint)uStack_150 >> 0x16) ^
                  ((uint)uStack_150 * 0x80000 | (uint)uStack_150 >> 0xd) ^
                  ((uint)uStack_150 * 0x40000000 | (uint)uStack_150 >> 2));
    uVar4 = *(uint *)((long)&local_168 + local_148 * 4);
    uVar19 = (uVar18 >> 10 ^ (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11)
             ) + uVar15 + *(int *)((long)&local_148 + local_148 * 4) +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    uVar5 = K[local_148 + 3];
    local_138[local_148 + 3] = uVar19;
    iVar16 = (uint)local_158 + uVar5 + uVar19 +
             (((uint)uStack_160 ^ uStack_160._4_4_) & local_168._4_4_ ^ uStack_160._4_4_) +
             ((local_168._4_4_ * 0x80 | local_168._4_4_ >> 0x19) ^
             (local_168._4_4_ * 0x200000 | local_168._4_4_ >> 0xb) ^
             (local_168._4_4_ * 0x4000000 | local_168._4_4_ >> 6));
    local_168._0_4_ = (uint)local_168 + iVar16;
    local_158._0_4_ =
         iVar16 + ((local_158._4_4_ | (uint)uStack_150) & uStack_150._4_4_ |
                  local_158._4_4_ & (uint)uStack_150) +
                  ((local_158._4_4_ * 0x400 | local_158._4_4_ >> 0x16) ^
                  (local_158._4_4_ * 0x80000 | local_158._4_4_ >> 0xd) ^
                  (local_158._4_4_ * 0x40000000 | local_158._4_4_ >> 2));
    uVar15 = *(uint *)((long)&local_168 + local_148 * 4 + 4);
    uVar18 = (uVar14 >> 10 ^ (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11)
             ) + uVar4 + *(int *)((long)&local_148 + local_148 * 4 + 4) +
             (uVar15 >> 3 ^ (uVar15 << 0xe | uVar15 >> 0x12) ^ (uVar15 << 0x19 | uVar15 >> 7));
    local_138[local_148 + 4] = uVar18;
    iVar16 = uStack_160._4_4_ + K[local_148 + 4] + uVar18 +
             ((local_168._4_4_ ^ (uint)uStack_160) & (uint)local_168 ^ (uint)uStack_160) +
             (((uint)local_168 * 0x80 | (uint)local_168 >> 0x19) ^
             ((uint)local_168 * 0x200000 | (uint)local_168 >> 0xb) ^
             ((uint)local_168 * 0x4000000 | (uint)local_168 >> 6));
    uStack_150._4_4_ = uStack_150._4_4_ + iVar16;
    uStack_160._4_4_ =
         (((uint)local_158 | local_158._4_4_) & (uint)uStack_150 | (uint)local_158 & local_158._4_4_
         ) + (((uint)local_158 * 0x400 | (uint)local_158 >> 0x16) ^
             ((uint)local_158 * 0x80000 | (uint)local_158 >> 0xd) ^
             ((uint)local_158 * 0x40000000 | (uint)local_158 >> 2)) + iVar16;
    uVar4 = *(uint *)((long)&uStack_160 + local_148 * 4);
    uVar14 = *(uint *)((long)&uStack_160 + local_148 * 4 + 4);
    uVar19 = (uVar19 >> 10 ^ (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11)
             ) + uVar15 + *(int *)((long)&local_140 + local_148 * 4) +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    iVar16 = (uint)uStack_160 + K[local_148 + 5] + uVar19 +
             (((uint)local_168 ^ local_168._4_4_) & uStack_150._4_4_ ^ local_168._4_4_) +
             ((uStack_150._4_4_ * 0x80 | uStack_150._4_4_ >> 0x19) ^
             (uStack_150._4_4_ * 0x200000 | uStack_150._4_4_ >> 0xb) ^
             (uStack_150._4_4_ * 0x4000000 | uStack_150._4_4_ >> 6));
    uStack_150._0_4_ = (uint)uStack_150 + iVar16;
    uStack_160._0_4_ =
         ((uStack_160._4_4_ | (uint)local_158) & local_158._4_4_ |
         uStack_160._4_4_ & (uint)local_158) +
         ((uStack_160._4_4_ * 0x400 | uStack_160._4_4_ >> 0x16) ^
         (uStack_160._4_4_ * 0x80000 | uStack_160._4_4_ >> 0xd) ^
         (uStack_160._4_4_ * 0x40000000 | uStack_160._4_4_ >> 2)) + iVar16;
    local_138[local_148 + 5] = uVar19;
    uVar15 = (uVar18 >> 10 ^ (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11)
             ) + uVar4 + *(int *)((long)&local_140 + local_148 * 4 + 4) +
             (uVar14 >> 3 ^ (uVar14 << 0xe | uVar14 >> 0x12) ^ (uVar14 << 0x19 | uVar14 >> 7));
    uVar5 = K[local_148 + 6];
    local_138[local_148 + 6] = uVar15;
    iVar16 = local_168._4_4_ + uVar5 + uVar15 +
             ((uStack_150._4_4_ ^ (uint)local_168) & (uint)uStack_150 ^ (uint)local_168) +
             (((uint)uStack_150 * 0x80 | (uint)uStack_150 >> 0x19) ^
             ((uint)uStack_150 * 0x200000 | (uint)uStack_150 >> 0xb) ^
             ((uint)uStack_150 * 0x4000000 | (uint)uStack_150 >> 6));
    local_158._4_4_ = local_158._4_4_ + iVar16;
    local_168._4_4_ =
         (((uint)uStack_160 | uStack_160._4_4_) & (uint)local_158 |
         (uint)uStack_160 & uStack_160._4_4_) +
         (((uint)uStack_160 * 0x400 | (uint)uStack_160 >> 0x16) ^
         ((uint)uStack_160 * 0x80000 | (uint)uStack_160 >> 0xd) ^
         ((uint)uStack_160 * 0x40000000 | (uint)uStack_160 >> 2)) + iVar16;
    local_138[0] = *(uint *)((long)&local_158 + local_148 * 4);
    uVar15 = uVar17 + uVar14 +
             (local_138[0] >> 3 ^
             (local_138[0] << 0xe | local_138[0] >> 0x12) ^
             (local_138[0] << 0x19 | local_138[0] >> 7)) +
             (uVar19 >> 10 ^ (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11)
             );
    uVar5 = K[local_148 + 7];
    local_138[local_148 + 7] = uVar15;
    iVar16 = (uint)local_168 + uVar5 + uVar15 +
             (((uint)uStack_150 ^ uStack_150._4_4_) & local_158._4_4_ ^ uStack_150._4_4_) +
             ((local_158._4_4_ * 0x80 | local_158._4_4_ >> 0x19) ^
             (local_158._4_4_ * 0x200000 | local_158._4_4_ >> 0xb) ^
             (local_158._4_4_ * 0x4000000 | local_158._4_4_ >> 6));
    local_158._0_4_ = (uint)local_158 + iVar16;
    local_168._0_4_ =
         ((local_168._4_4_ | (uint)uStack_160) & uStack_160._4_4_ |
         local_168._4_4_ & (uint)uStack_160) +
         ((local_168._4_4_ * 0x400 | local_168._4_4_ >> 0x16) ^
         (local_168._4_4_ * 0x80000 | local_168._4_4_ >> 0xd) ^
         (local_168._4_4_ * 0x40000000 | local_168._4_4_ >> 2)) + iVar16;
    bVar20 = local_148 < 0x38;
    local_148 = local_148 + 8;
  } while (bVar20);
  lVar12 = 0;
  do {
    puVar1 = local_140 + lVar12;
    uVar5 = puVar1[1];
    uVar6 = puVar1[2];
    uVar7 = puVar1[3];
    lVar3 = lVar12 * 4;
    iVar16 = *(int *)((long)&local_168 + lVar3 + 4);
    iVar8 = *(int *)((long)&uStack_160 + lVar3);
    iVar9 = *(int *)((long)&uStack_160 + lVar3 + 4);
    puVar2 = local_140 + lVar12;
    *puVar2 = *puVar1 + *(int *)((long)&local_168 + lVar3);
    puVar2[1] = uVar5 + iVar16;
    puVar2[2] = uVar6 + iVar8;
    puVar2[3] = uVar7 + iVar9;
    lVar12 = lVar12 + 4;
  } while (lVar12 != 8);
  return 0;
}

Assistant:

int mbedtls_internal_sha256_process( mbedtls_sha256_context *ctx,
                                const unsigned char data[64] )
{
    uint32_t temp1, temp2, W[64];
    uint32_t A[8];
    unsigned int i;

    for( i = 0; i < 8; i++ )
        A[i] = ctx->state[i];

#if defined(MBEDTLS_SHA256_SMALLER)
    for( i = 0; i < 64; i++ )
    {
        if( i < 16 )
            GET_UINT32_BE( W[i], data, 4 * i );
        else
            R( i );

        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] );

        temp1 = A[7]; A[7] = A[6]; A[6] = A[5]; A[5] = A[4]; A[4] = A[3];
        A[3] = A[2]; A[2] = A[1]; A[1] = A[0]; A[0] = temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for( i = 0; i < 16; i++ )
        GET_UINT32_BE( W[i], data, 4 * i );

    for( i = 0; i < 16; i += 8 )
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i+0], K[i+0] );
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i+1], K[i+1] );
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i+2], K[i+2] );
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i+3], K[i+3] );
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i+4], K[i+4] );
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i+5], K[i+5] );
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i+6], K[i+6] );
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i+7], K[i+7] );
    }

    for( i = 16; i < 64; i += 8 )
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], R(i+0), K[i+0] );
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], R(i+1), K[i+1] );
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], R(i+2), K[i+2] );
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], R(i+3), K[i+3] );
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], R(i+4), K[i+4] );
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], R(i+5), K[i+5] );
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], R(i+6), K[i+6] );
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], R(i+7), K[i+7] );
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for( i = 0; i < 8; i++ )
        ctx->state[i] += A[i];

    return( 0 );
}